

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O2

ReadResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::Read
          (CordRepBtreeNavigator *this,size_t edge_offset,size_t n)

{
  long lVar1;
  CordRep *pCVar2;
  CordRepBtree *rep;
  CordRep *rep_00;
  size_t sVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  uint8_t uVar6;
  ulong n_00;
  uint height;
  ulong uVar7;
  ulong index;
  ReadResult RVar8;
  long local_50;
  byte local_48;
  CordRepBtree *local_40;
  ulong local_38;
  
  index = (ulong)this->index_[0];
  pCVar4 = this->node_[0];
  pCVar2 = CordRepBtree::Edge(pCVar4,index);
  uVar7 = pCVar2->length;
  if (uVar7 < edge_offset || uVar7 - edge_offset == 0) {
    __assert_fail("edge_offset < edge->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x72,
                  "ReadResult absl::cord_internal::CordRepBtreeNavigator::Read(size_t, size_t)");
  }
  n_00 = n + edge_offset;
  if (uVar7 <= n_00) {
    rep_00 = anon_unknown_10::Substring(pCVar2,edge_offset,uVar7 - edge_offset);
    rep = CordRepBtree::New(rep_00);
    sVar3 = pCVar2->length;
    local_50 = 1;
    local_38 = 0;
    do {
      n_00 = n_00 - sVar3;
      local_38 = (ulong)(int)local_38;
      while (index = index + 1, index == (pCVar4->super_CordRep).storage[2]) {
        this->index_[local_38] = (uint8_t)index;
        if ((long)this->height_ <= (long)local_38) {
          (rep->super_CordRep).storage[2] = (uint8_t)local_50;
          if (n_00 == 0) {
            n_00 = 0;
          }
          else {
            CordRep::Unref(&rep->super_CordRep);
            rep = (CordRepBtree *)0x0;
          }
          goto LAB_0027886a;
        }
        if (n_00 != 0) {
          (rep->super_CordRep).storage[2] = (uint8_t)local_50;
          rep = CordRepBtree::New(&rep->super_CordRep);
          local_50 = 1;
        }
        pCVar4 = this->node_[local_38 + 1];
        lVar1 = local_38 + 1;
        local_38 = local_38 + 1;
        index = (ulong)this->index_[lVar1];
      }
      pCVar2 = CordRepBtree::Edge(pCVar4,index);
      sVar3 = pCVar2->length;
      if (sVar3 <= n_00) {
        (rep->super_CordRep).length = (rep->super_CordRep).length + sVar3;
        LOCK();
        (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        rep->edges_[local_50] = pCVar2;
        local_50 = local_50 + 1;
        sVar3 = pCVar2->length;
      }
    } while (sVar3 <= n_00);
    (rep->super_CordRep).length = (rep->super_CordRep).length + n_00;
    local_38 = local_38 & 0xffffffff;
    local_40 = rep;
    do {
      uVar7 = local_38 & 0xffffffff;
      local_48 = (byte)index;
      sVar3 = n_00;
      do {
        n_00 = sVar3;
        uVar6 = (uint8_t)local_50;
        if ((int)uVar7 < 1) {
          if (n_00 != 0) {
            pCVar2 = anon_unknown_10::Substring(pCVar2,0,n_00);
            local_40->edges_[local_50] = pCVar2;
            uVar6 = uVar6 + '\x01';
          }
          (local_40->super_CordRep).storage[2] = uVar6;
          this->index_[0] = local_48;
          goto LAB_0027886a;
        }
        pCVar4 = CordRep::btree(pCVar2);
        this->index_[local_38] = local_48;
        local_38 = local_38 - 1;
        this->node_[local_38 & 0xffffffff] = pCVar4;
        local_48 = (pCVar4->super_CordRep).storage[1];
        index = (ulong)local_48;
        pCVar2 = CordRepBtree::Edge(pCVar4,index);
        height = (int)uVar7 - 1;
        uVar7 = (ulong)height;
        sVar3 = 0;
      } while (n_00 == 0);
      pCVar5 = CordRepBtree::New(height);
      (pCVar5->super_CordRep).length = n_00;
      local_40->edges_[local_50] = &pCVar5->super_CordRep;
      (local_40->super_CordRep).storage[2] = uVar6 + '\x01';
      local_50 = 0;
      while (sVar3 = pCVar2->length, local_40 = pCVar5, pCVar2->length <= n_00) {
        LOCK();
        (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar5->edges_[local_50] = pCVar2;
        local_50 = local_50 + 1;
        index = index + 1;
        pCVar2 = CordRepBtree::Edge(pCVar4,index);
        n_00 = n_00 - sVar3;
      }
    } while( true );
  }
  rep = (CordRepBtree *)anon_unknown_10::Substring(pCVar2,edge_offset,n);
LAB_0027886a:
  RVar8.n = n_00;
  RVar8.tree = &rep->super_CordRep;
  return RVar8;
}

Assistant:

ReadResult CordRepBtreeNavigator::Read(size_t edge_offset, size_t n) {
  int height = 0;
  size_t length = edge_offset + n;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);
  assert(edge_offset < edge->length);

  if (length < edge->length) {
    return {Substring(edge, edge_offset, n), length};
  }

  // Similar to 'Skip', we consume all edges that are inside the 'length' of
  // data that needs to be read. If we exhaust the current level, we move one
  // level up the tree and repeat until we hit the final edge that must be
  // (partially) read. We consume all edges into `subtree`.
  CordRepBtree* subtree = CordRepBtree::New(Substring(edge, edge_offset));
  size_t subtree_end = 1;
  do {
    length -= edge->length;
    while (++index == node->end()) {
      index_[height] = static_cast<uint8_t>(index);
      if (++height > height_) {
        subtree->set_end(subtree_end);
        if (length == 0) return {subtree, 0};
        CordRep::Unref(subtree);
        return {nullptr, length};
      }
      if (length != 0) {
        subtree->set_end(subtree_end);
        subtree = CordRepBtree::New(subtree);
        subtree_end = 1;
      }
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
    if (length >= edge->length) {
      subtree->length += edge->length;
      subtree->edges_[subtree_end++] = CordRep::Ref(edge);
    }
  } while (length >= edge->length);
  CordRepBtree* tree = subtree;
  subtree->length += length;

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be read, adding 'down' nodes to `subtree`.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);

    if (length != 0) {
      CordRepBtree* right = CordRepBtree::New(height);
      right->length = length;
      subtree->edges_[subtree_end++] = right;
      subtree->set_end(subtree_end);
      subtree = right;
      subtree_end = 0;
      while (length >= edge->length) {
        subtree->edges_[subtree_end++] = CordRep::Ref(edge);
        length -= edge->length;
        edge = node->Edge(++index);
      }
    }
  }
  // Add any (partial) edge still remaining at the leaf level.
  if (length != 0) {
    subtree->edges_[subtree_end++] = Substring(edge, 0, length);
  }
  subtree->set_end(subtree_end);
  index_[0] = static_cast<uint8_t>(index);
  return {tree, length};
}